

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1517.c
# Opt level: O2

size_t read_callback(void *ptr,size_t size,size_t nmemb,void *userp)

{
  ulong uVar1;
  ulong __n;
  
  __n = size * nmemb;
  wait_ms(1000);
  if ((__n == 0) || (uVar1 = *(ulong *)((long)userp + 8), uVar1 == 0)) {
    __n = 0;
  }
  else {
    if (uVar1 < __n) {
      __n = uVar1;
    }
    memcpy(ptr,*userp,__n);
    *(ulong *)userp = *userp + __n;
    *(long *)((long)userp + 8) = *(long *)((long)userp + 8) - __n;
  }
  return __n;
}

Assistant:

static size_t read_callback(void *ptr, size_t size, size_t nmemb, void *userp)
{
  struct WriteThis *pooh = (struct WriteThis *)userp;
  size_t tocopy = size * nmemb;

  /* Wait one second before return POST data          *
   * so libcurl will wait before sending request body */
  wait_ms(1000);

  if(tocopy < 1 || !pooh->sizeleft)
    return 0;

  if(pooh->sizeleft < tocopy)
    tocopy = pooh->sizeleft;

  memcpy(ptr, pooh->readptr, tocopy);/* copy requested data */
  pooh->readptr += tocopy;           /* advance pointer */
  pooh->sizeleft -= tocopy;          /* less data left */
  return tocopy;
}